

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_decompose.hpp
# Opt level: O1

result * __thiscall
lest::expression_lhs<char_const*const&>::operator>
          (result *__return_storage_ptr__,expression_lhs<char_const*const&> *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *rhs)

{
  lest *this_00;
  byte extraout_var;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  char *local_48 [2];
  char local_38 [16];
  
  std::__cxx11::string::compare((char *)rhs);
  __return_storage_ptr__->passed = (bool)(extraout_var >> 7);
  this_00 = *(lest **)this;
  local_48[0] = local_38;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_48,">","");
  to_string<char_const*,std::__cxx11::string>
            (&__return_storage_ptr__->decomposition,this_00,local_48,rhs,in_R8);
  if (local_48[0] != local_38) {
    operator_delete(local_48[0]);
  }
  return __return_storage_ptr__;
}

Assistant:

result operator>=( R const & rhs ) { return result{ lhs >= rhs, to_string( lhs, ">=", rhs ) }; }